

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

ostream * smf::MidiFile::writeLittleEndianDouble(ostream *out,double value)

{
  undefined1 local_20;
  undefined1 uStack_1f;
  undefined1 uStack_1e;
  undefined1 uStack_1d;
  undefined1 uStack_1c;
  undefined1 uStack_1b;
  undefined1 uStack_1a;
  undefined1 uStack_19;
  anon_union_8_2_a3e1d9ba data;
  double value_local;
  ostream *out_local;
  
  local_20 = SUB81(value,0);
  std::operator<<(out,local_20);
  uStack_1f = (char)((ulong)value >> 8);
  std::operator<<(out,uStack_1f);
  uStack_1e = (char)((ulong)value >> 0x10);
  std::operator<<(out,uStack_1e);
  uStack_1d = (char)((ulong)value >> 0x18);
  std::operator<<(out,uStack_1d);
  uStack_1c = (char)((ulong)value >> 0x20);
  std::operator<<(out,uStack_1c);
  uStack_1b = (char)((ulong)value >> 0x28);
  std::operator<<(out,uStack_1b);
  uStack_1a = (char)((ulong)value >> 0x30);
  std::operator<<(out,uStack_1a);
  uStack_19 = (char)((ulong)value >> 0x38);
  std::operator<<(out,uStack_19);
  return out;
}

Assistant:

std::ostream& MidiFile::writeLittleEndianDouble(std::ostream& out, double value) {
	union { char bytes[8]; double d; } data;
	data.d = value;
	out << data.bytes[0];
	out << data.bytes[1];
	out << data.bytes[2];
	out << data.bytes[3];
	out << data.bytes[4];
	out << data.bytes[5];
	out << data.bytes[6];
	out << data.bytes[7];
	return out;
}